

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void __thiscall ImGui::DockContextUpdateDocking(ImGui *this,ImGuiContext *ctx)

{
  int *piVar1;
  int *piVar2;
  void *pvVar3;
  ImGui *this_00;
  int iVar4;
  void *__dest;
  ImGuiContext *g;
  long lVar5;
  long lVar6;
  
  if (((byte)this[8] & 0x40) != 0) {
    piVar2 = *(int **)(this + 0x2ec0);
    iVar4 = piVar2[4];
    if (0 < iVar4) {
      lVar6 = 0;
      lVar5 = 0;
      do {
        ctx = *(ImGuiContext **)(piVar2 + 6);
        if (*(int *)((long)(ctx->IO).KeyMap + lVar6 + -0x3c) == 1) {
          ctx = (ImGuiContext *)((long)(ctx->IO).KeyMap + lVar6 + -0x3c);
          DockContextProcessDock((ImGuiContext *)this,(ImGuiDockRequest *)ctx);
          iVar4 = piVar2[4];
        }
        lVar5 = lVar5 + 1;
        lVar6 = lVar6 + 0x40;
      } while (lVar5 < iVar4);
    }
    if (piVar2[5] < 0) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
      ctx = *(ImGuiContext **)(piVar2 + 6);
      if (ctx != (ImGuiContext *)0x0) {
        memcpy(__dest,ctx,(long)piVar2[4] << 6);
        pvVar3 = *(void **)(piVar2 + 6);
        if ((pvVar3 != (void *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        ctx = (ImGuiContext *)GImAllocatorUserData;
        (*GImAllocatorFreeFunc)(pvVar3,GImAllocatorUserData);
      }
      *(void **)(piVar2 + 6) = __dest;
      piVar2[5] = 0;
    }
    piVar2[4] = 0;
    iVar4 = *piVar2;
    if (0 < iVar4) {
      lVar5 = 8;
      lVar6 = 0;
      do {
        this_00 = *(ImGui **)(*(long *)(piVar2 + 2) + lVar5);
        if (((this_00 != (ImGui *)0x0) && (*(long *)(this_00 + 0x10) == 0)) &&
           ((*(uint *)(this_00 + 8) & 0x400) == 0)) {
          DockNodeUpdate(this_00,(ImGuiDockNode *)ctx);
          iVar4 = *piVar2;
        }
        lVar6 = lVar6 + 1;
        lVar5 = lVar5 + 0x10;
      } while (lVar6 < iVar4);
    }
  }
  return;
}

Assistant:

void ImGui::DockContextUpdateDocking(ImGuiContext* ctx)
{
    ImGuiContext& g = *ctx;
    ImGuiDockContext* dc = ctx->DockContext;
    if (!(g.IO.ConfigFlags & ImGuiConfigFlags_DockingEnable))
        return;

    // Process Docking requests
    for (int n = 0; n < dc->Requests.Size; n++)
        if (dc->Requests[n].Type == ImGuiDockRequestType_Dock)
            DockContextProcessDock(ctx, &dc->Requests[n]);
    dc->Requests.resize(0);

    // Create windows for each automatic docking nodes
    // We can have NULL pointers when we delete nodes, but because ID are recycled this should amortize nicely (and our node count will never be very high)
    for (int n = 0; n < dc->Nodes.Data.Size; n++)
        if (ImGuiDockNode* node = (ImGuiDockNode*)dc->Nodes.Data[n].val_p)
            if (node->IsFloatingNode())
                DockNodeUpdate(node);
}